

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9MuxPos(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  bool bVar3;
  int fVerbose;
  int c;
  Gia_Man_t *pGia;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar3 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 == -1) {
      bVar3 = pAbc->pGia != (Gia_Man_t *)0x0;
      if (bVar3) {
        pNew = Gia_ManDupWithMuxPos(pAbc->pGia);
        Abc_FrameUpdateGia(pAbc,pNew);
      }
      else {
        Abc_Print(-1,"Abc_CommandAbc9MuxPos(): There is no AIG.\n");
      }
      pAbc_local._4_4_ = (uint)!bVar3;
      return pAbc_local._4_4_;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    bVar3 = (bool)(bVar3 ^ 1);
  }
  Abc_Print(-2,"usage: &muxpos [-vh]\n");
  Abc_Print(-2,"\t         create additional POs to preserve MUXes\n");
  pcVar2 = "no";
  if (bVar3) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9MuxPos( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManDupWithMuxPos( Gia_Man_t * p );
    Gia_Man_t * pGia;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9MuxPos(): There is no AIG.\n" );
        return 1;
    }
    pGia = Gia_ManDupWithMuxPos( pAbc->pGia );
    Abc_FrameUpdateGia( pAbc, pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: &muxpos [-vh]\n" );
    Abc_Print( -2, "\t         create additional POs to preserve MUXes\n" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}